

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  ReduceLayerParams_ReduceAxis RVar3;
  Tensor *this_00;
  ReduceLayerParams *this_01;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  int iStack_f8;
  bool sufficientInputRank;
  int rank;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,1);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    Result::~Result((Result *)(local_d0 + 0x28));
  }
  if (((this->ndArrayInterpretation & 1U) != 0) &&
     (iVar2 = Specification::NeuralNetworkLayer::inputtensor_size((NeuralNetworkLayer *)r._32_8_),
     layer_00 = r._32_8_, 0 < iVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f0,"Reduce",(allocator *)((long)&rank + 3));
    validateInputOutputRankEquality
              ((Result_conflict *)local_d0,(NeuralNetworkLayer *)layer_00,(string *)local_f0,
               &this->blobNameToRank);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
    Result::~Result((Result *)local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rank + 3));
    bVar1 = Result::good((Result *)(local_70 + 0x28));
    if (!bVar1) {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      iStack_f8 = 1;
      goto LAB_00400ba2;
    }
    this_00 = Specification::NeuralNetworkLayer::inputtensor((NeuralNetworkLayer *)r._32_8_,0);
    local_120._M_storage._M_storage._4_4_ = Specification::Tensor::rank(this_00);
    local_120._M_storage._M_storage[3] = 1;
    std::__cxx11::string::string((string *)&local_120);
    this_01 = Specification::NeuralNetworkLayer::reduce((NeuralNetworkLayer *)r._32_8_);
    RVar3 = Specification::ReduceLayerParams::axis(this_01);
    if (RVar3 == ReduceLayerParams_ReduceAxis_CHW) {
      if ((int)local_120._M_storage._M_storage._4_4_ < 3) {
        local_120._M_storage._M_storage[3] = 0;
      }
LAB_00400a4b:
      if ((local_120._M_storage._M_storage[3] & 1) == 0) {
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
        std::__cxx11::string::string((string *)&local_1e0,(string *)psVar4);
        std::operator+(&local_1c0,"Reduce layer \'",&local_1e0);
        std::operator+(&local_1a0,&local_1c0,
                       "\': input\'s rank is smaller than the dimensions provided in the axis parameter"
                      );
        std::__cxx11::string::operator=((string *)&local_120,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_120);
        iStack_f8 = 1;
      }
      else {
        iStack_f8 = 0;
      }
    }
    else {
      if (RVar3 == ReduceLayerParams_ReduceAxis_HW) {
        if ((int)local_120._M_storage._M_storage._4_4_ < 2) {
          local_120._M_storage._M_storage[3] = 0;
        }
        goto LAB_00400a4b;
      }
      if (RVar3 == ReduceLayerParams_ReduceAxis_C) {
        if ((int)local_120._M_storage._M_storage._4_4_ < 1) {
          local_120._M_storage._M_storage[3] = 0;
        }
        goto LAB_00400a4b;
      }
      if (RVar3 == ReduceLayerParams_ReduceAxis_H) {
        if ((int)local_120._M_storage._M_storage._4_4_ < 1) {
          local_120._M_storage._M_storage[3] = 0;
        }
        goto LAB_00400a4b;
      }
      if (RVar3 == ReduceLayerParams_ReduceAxis_W) {
        if ((int)local_120._M_storage._M_storage._4_4_ < 1) {
          local_120._M_storage._M_storage[3] = 0;
        }
        goto LAB_00400a4b;
      }
      if (RVar3 != 
          ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_)
      goto LAB_00400a4b;
      psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_((NeuralNetworkLayer *)r._32_8_);
      std::__cxx11::string::string((string *)&local_180,(string *)psVar4);
      std::operator+(&local_160,"Reduce layer: \'",&local_180);
      std::operator+(&local_140,&local_160,"\': unknown value for parameter \'axis\'.");
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_120);
      iStack_f8 = 1;
    }
    std::__cxx11::string::~string((string *)&local_120);
    if (iStack_f8 != 0) goto LAB_00400ba2;
  }
  Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  iStack_f8 = 1;
LAB_00400ba2:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        r = validateInputOutputRankEquality(layer, "Reduce", blobNameToRank);
        if (!r.good()) {return r;}
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}